

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr.c
# Opt level: O0

natwm_error randr_get_screens(natwm_state *state,randr_monitor ***result,size_t *length)

{
  undefined4 uVar1;
  int iVar2;
  void *__ptr;
  randr_monitor **__ptr_00;
  long lVar3;
  void *__ptr_01;
  void *__ptr_02;
  randr_monitor *prVar4;
  int local_8c;
  int j;
  randr_monitor *monitor;
  xcb_rectangle_t screen_rect;
  xcb_randr_get_crtc_info_reply_t *crtc_info_reply;
  xcb_randr_get_crtc_info_cookie_t crtc_info_cookie;
  xcb_randr_get_output_info_reply_t *output_info_reply;
  xcb_randr_get_output_info_cookie_t cookie;
  int i;
  xcb_randr_output_t *outputs;
  randr_monitor **monitors;
  int screen_count;
  xcb_randr_get_screen_resources_reply_t *resources_reply;
  void *pvStack_30;
  xcb_randr_get_screen_resources_cookie_t resources_cookie;
  xcb_generic_error_t *err;
  size_t *length_local;
  randr_monitor ***result_local;
  natwm_state *state_local;
  
  pvStack_30 = (void *)0x0;
  uVar1 = xcb_randr_get_screen_resources(state->xcb,state->screen->root);
  __ptr = (void *)xcb_randr_get_screen_resources_reply(state->xcb,uVar1,&stack0xffffffffffffffd0);
  if ((pvStack_30 == (void *)0x0) && (__ptr != (void *)0x0)) {
    iVar2 = xcb_randr_get_screen_resources_outputs_length(__ptr);
    if (iVar2 < 1) {
      __assert_fail("screen_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/randr.c"
                    ,0x2f,
                    "enum natwm_error randr_get_screens(const struct natwm_state *, struct randr_monitor ***, size_t *)"
                   );
    }
    __ptr_00 = (randr_monitor **)calloc((long)iVar2,8);
    if (__ptr_00 == (randr_monitor **)0x0) {
      free(__ptr);
      state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
    }
    else {
      lVar3 = xcb_randr_get_screen_resources_outputs(__ptr);
      for (output_info_reply._4_4_ = 0; output_info_reply._4_4_ < iVar2;
          output_info_reply._4_4_ = output_info_reply._4_4_ + 1) {
        uVar1 = xcb_randr_get_output_info
                          (state->xcb,*(undefined4 *)(lVar3 + (long)output_info_reply._4_4_ * 4),0);
        __ptr_01 = (void *)xcb_randr_get_output_info_reply
                                     (state->xcb,uVar1,&stack0xffffffffffffffd0);
        if ((pvStack_30 == (void *)0x0) || (__ptr_01 != (void *)0x0)) {
          uVar1 = xcb_randr_get_crtc_info(state->xcb,*(undefined4 *)((long)__ptr_01 + 0xc),0);
          __ptr_02 = (void *)xcb_randr_get_crtc_info_reply
                                       (state->xcb,uVar1,&stack0xffffffffffffffd0);
          if ((pvStack_30 == (void *)0x0) || (__ptr_02 != (void *)0x0)) {
            prVar4 = randr_monitor_create
                               (*(xcb_randr_crtc_t *)((long)__ptr_01 + 0xc),
                                *(xcb_rectangle_t *)((long)__ptr_02 + 0xc));
            if (prVar4 == (randr_monitor *)0x0) {
              for (local_8c = 0; local_8c < output_info_reply._4_4_; local_8c = local_8c + 1) {
                if (__ptr_00[local_8c] != (randr_monitor *)0x0) {
                  randr_monitor_destroy(__ptr_00[local_8c]);
                }
              }
              free(__ptr_00);
              return MEMORY_ALLOCATION_ERROR;
            }
            __ptr_00[output_info_reply._4_4_] = prVar4;
            free(__ptr_02);
            free(__ptr_01);
          }
          else {
            free(__ptr_01);
            free(pvStack_30);
          }
        }
        else {
          internal_logger(natwm_logger,LEVEL_WARNING,"Failed to get info for a RANDR screen.");
          free(pvStack_30);
        }
      }
      xcb_randr_select_input(state->xcb,state->screen->root,1);
      *result = __ptr_00;
      *length = (long)iVar2;
      free(__ptr);
      state_local._4_4_ = NO_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to get RANDR screens");
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    state_local._4_4_ = GENERIC_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error randr_get_screens(const struct natwm_state *state, struct randr_monitor ***result,
                                   size_t *length)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_randr_get_screen_resources_cookie_t resources_cookie
                = xcb_randr_get_screen_resources(state->xcb, state->screen->root);
        xcb_randr_get_screen_resources_reply_t *resources_reply
                = xcb_randr_get_screen_resources_reply(state->xcb, resources_cookie, &err);

        if (err != XCB_NONE || resources_reply == NULL) {
                LOG_ERROR(natwm_logger, "Failed to get RANDR screens");

                if (resources_reply != NULL) {
                        free(resources_reply);
                }

                return GENERIC_ERROR;
        }

        int screen_count = xcb_randr_get_screen_resources_outputs_length(resources_reply);

        assert(screen_count > 0);

        struct randr_monitor **monitors
                = calloc((size_t)screen_count, sizeof(struct randr_monitor *));

        if (monitors == NULL) {
                free(resources_reply);

                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_randr_output_t *outputs = xcb_randr_get_screen_resources_outputs(resources_reply);

        for (int i = 0; i < screen_count; ++i) {
                xcb_randr_get_output_info_cookie_t cookie
                        = xcb_randr_get_output_info(state->xcb, outputs[i], XCB_CURRENT_TIME);
                xcb_randr_get_output_info_reply_t *output_info_reply
                        = xcb_randr_get_output_info_reply(state->xcb, cookie, &err);

                if (err != XCB_NONE && output_info_reply == NULL) {
                        LOG_WARNING(natwm_logger, "Failed to get info for a RANDR screen.");

                        free(err);

                        continue;
                }

                xcb_randr_get_crtc_info_cookie_t crtc_info_cookie = xcb_randr_get_crtc_info(
                        state->xcb, output_info_reply->crtc, XCB_CURRENT_TIME);
                xcb_randr_get_crtc_info_reply_t *crtc_info_reply
                        = xcb_randr_get_crtc_info_reply(state->xcb, crtc_info_cookie, &err);

                if (err != XCB_NONE && crtc_info_reply == NULL) {
                        // We encounter this when we find an inactive RANDR
                        // screens
                        free(output_info_reply);
                        free(err);

                        continue;
                }

                xcb_rectangle_t screen_rect = {
                        .x = crtc_info_reply->x,
                        .y = crtc_info_reply->y,
                        .width = crtc_info_reply->width,
                        .height = crtc_info_reply->height,
                };

                struct randr_monitor *monitor
                        = randr_monitor_create(output_info_reply->crtc, screen_rect);

                if (monitor == NULL) {
                        // Mem error, need to free existing monitors
                        for (int j = 0; j < i; ++j) {
                                if (monitors[j] != NULL) {
                                        randr_monitor_destroy(monitors[j]);
                                }
                        }

                        free(monitors);

                        return MEMORY_ALLOCATION_ERROR;
                }

                monitors[i] = monitor;

                free(crtc_info_reply);
                free(output_info_reply);
        }

        // Listen for events
        xcb_randr_select_input(
                state->xcb, state->screen->root, XCB_RANDR_NOTIFY_MASK_SCREEN_CHANGE);

        *result = monitors;
        *length = (size_t)screen_count;

        free(resources_reply);

        return NO_ERROR;
}